

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O0

void P_AdjustLine(line_t_conflict *ld)

{
  vertex_t *this;
  vertex_t *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  vertex_t *v2;
  vertex_t *v1;
  line_t_conflict *ld_local;
  
  this = ld->v1;
  this_00 = ld->v2;
  dVar1 = vertex_t::fX(this_00);
  dVar2 = vertex_t::fX(this);
  dVar3 = vertex_t::fY(this_00);
  dVar4 = vertex_t::fY(this);
  line_t::setDelta((line_t *)ld,dVar1 - dVar2,dVar3 - dVar4);
  dVar1 = vertex_t::fX(this);
  dVar2 = vertex_t::fX(this_00);
  if (dVar2 <= dVar1) {
    dVar1 = vertex_t::fX(this_00);
    ld->bbox[2] = dVar1;
    dVar1 = vertex_t::fX(this);
    ld->bbox[3] = dVar1;
  }
  else {
    dVar1 = vertex_t::fX(this);
    ld->bbox[2] = dVar1;
    dVar1 = vertex_t::fX(this_00);
    ld->bbox[3] = dVar1;
  }
  dVar1 = vertex_t::fY(this);
  dVar2 = vertex_t::fY(this_00);
  if (dVar2 <= dVar1) {
    dVar1 = vertex_t::fY(this_00);
    ld->bbox[1] = dVar1;
    dVar1 = vertex_t::fY(this);
    ld->bbox[0] = dVar1;
  }
  else {
    dVar1 = vertex_t::fY(this);
    ld->bbox[1] = dVar1;
    dVar1 = vertex_t::fY(this_00);
    ld->bbox[0] = dVar1;
  }
  return;
}

Assistant:

void P_AdjustLine (line_t *ld)
{
	vertex_t *v1, *v2;

	v1 = ld->v1;
	v2 = ld->v2;

	ld->setDelta(v2->fX() - v1->fX(), v2->fY() - v1->fY());
	
	if (v1->fX() < v2->fX())
	{
		ld->bbox[BOXLEFT] = v1->fX();
		ld->bbox[BOXRIGHT] = v2->fX();
	}
	else
	{
		ld->bbox[BOXLEFT] = v2->fX();
		ld->bbox[BOXRIGHT] = v1->fX();
	}

	if (v1->fY() < v2->fY())
	{
		ld->bbox[BOXBOTTOM] = v1->fY();
		ld->bbox[BOXTOP] = v2->fY();
	}
	else
	{
		ld->bbox[BOXBOTTOM] = v2->fY();
		ld->bbox[BOXTOP] = v1->fY();
	}
}